

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintMAC(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  bool swap16_local;
  uint8_t *addr_local;
  char *name_local;
  ostream *outStr_local;
  
  if (swap16) {
    poVar3 = std::operator<<(outStr,name);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[1]);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*addr);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[3]);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[2]);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[5]);
    poVar3 = std::operator<<(poVar3,":");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)addr[4]);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<(outStr,name);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*addr);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[1]);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[2]);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[3]);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)addr[4]);
    poVar3 = std::operator<<(poVar3,":");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)addr[5]);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void EthBasePort::PrintMAC(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[1] << ":" << (int)addr[0] << ":" << (int)addr[3] << ":"
               << (int)addr[2] << ":" << (int)addr[5] << ":" << (int)addr[4] << std::dec << std::endl;
    }
    else {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[0] << ":" << (int)addr[1] << ":" << (int)addr[2] << ":"
               << (int)addr[3] << ":" << (int)addr[4] << ":" << (int)addr[5] << std::dec << std::endl;
    }
}